

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<2L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,
          vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
          *control_points)

{
  type_conflict tVar1;
  size_type sVar2;
  VectorXd *degree;
  Index IVar3;
  Index IVar4;
  Index IVar5;
  runtime_error *this_00;
  const_reference pvVar6;
  DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *other;
  type_conflict *ptVar7;
  Scalar *pSVar8;
  RowXpr local_98;
  size_type local_68;
  Index i;
  long local_58;
  Index local_50 [3];
  vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
  *local_38;
  vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
  *control_points_local;
  VectorXd *knots_v_local;
  VectorXd *knots_u_local;
  Index degree_v_local;
  Index degree_u_local;
  NurbsSurfaceGeometry<2L> *this_local;
  
  local_38 = control_points;
  control_points_local =
       (vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
        *)knots_v;
  knots_v_local = knots_u;
  knots_u_local = (VectorXd *)degree_v;
  degree_v_local = degree_u;
  degree_u_local = (Index)this;
  SurfaceBase<2L>::SurfaceBase(&this->super_SurfaceBase<2L>);
  IVar4 = degree_v_local;
  (this->super_SurfaceBase<2L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_00773f70;
  this->m_degree_u = degree_v_local;
  this->m_degree_v = (Index)knots_u_local;
  IVar3 = length<Eigen::Matrix<double,_1,1,0,_1,1>>(knots_v_local);
  IVar4 = Nurbs::nb_poles(IVar4,IVar3);
  degree = knots_u_local;
  this->m_nb_poles_u = IVar4;
  IVar4 = length<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)control_points_local);
  IVar4 = Nurbs::nb_poles((Index)degree,IVar4);
  this->m_nb_poles_v = IVar4;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->m_knots_u,knots_v_local);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&this->m_knots_v,(Matrix<double,__1,_1,_0,__1,_1> *)control_points_local);
  local_50[0] = length<std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
                          (local_38);
  local_58 = 2;
  Eigen::Matrix<double,-1,2,1,-1,2>::Matrix<long,long>
            ((Matrix<double,_1,2,1,_1,2> *)&this->m_poles,local_50,&local_58);
  i = length<std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
                (local_38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_weights,&i);
  IVar4 = nb_poles_u(this);
  IVar3 = nb_poles_v(this);
  IVar5 = length<std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
                    (local_38);
  if (IVar4 * IVar3 != IVar5) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Number of knots and control points do not match");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68 = 0;
  while( true ) {
    sVar2 = local_68;
    IVar4 = length<std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
                      (local_38);
    if (IVar4 <= (long)sVar2) break;
    pvVar6 = std::
             vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
             ::operator[](local_38,local_68);
    other = (DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
            std::get<0ul,Eigen::Matrix<double,1,2,1,1,2>,double>(pvVar6);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>_>::row
              (&local_98,(DenseBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_> *)&this->m_poles,
               local_68);
    Eigen::Block<Eigen::Matrix<double,-1,2,1,-1,2>,1,2,true>::operator=
              ((Block<Eigen::Matrix<double,_1,2,1,_1,2>,1,2,true> *)&local_98,other);
    pvVar6 = std::
             vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
             ::operator[](local_38,local_68);
    ptVar7 = std::get<1ul,Eigen::Matrix<double,1,2,1,1,2>,double>(pvVar6);
    tVar1 = *ptVar7;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->m_weights,local_68);
    *pSVar8 = tVar1;
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const std::vector<ControlPoint>& control_points)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(length(control_points), TDimension)
        , m_weights(length(control_points))
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != length(control_points)) {
            throw std::runtime_error("Number of knots and control points do not match");
        }

        for (Index i = 0; i < length(control_points); i++) {
            m_poles.row(i) = std::get<0>(control_points[i]);
            m_weights[i] = std::get<1>(control_points[i]);
        }
    }